

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileMtlImporter.cpp
# Opt level: O2

void __thiscall Assimp::ObjFileMtlImporter::~ObjFileMtlImporter(ObjFileMtlImporter *this)

{
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

ObjFileMtlImporter::~ObjFileMtlImporter()
{
    // empty
}